

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O2

void __thiscall
InvalidIndex_InsertIntoIndexAtWrongRevision_Test::InvalidIndex_InsertIntoIndexAtWrongRevision_Test
          (InvalidIndex_InsertIntoIndexAtWrongRevision_Test *this)

{
  anon_unknown.dwarf_13be9a::IndexFixture::IndexFixture((IndexFixture *)this);
  (this->super_InvalidIndex).super_IndexFixture.super_Test._vptr_Test =
       (_func_int **)&PTR__IndexFixture_002574a0;
  return;
}

Assistant:

TEST_F (InvalidIndex, InsertIntoIndexAtWrongRevision) {
    {
        transaction_type t1 = begin (db_, lock_guard{mutex_});
        auto r1index = pstore::index::get_index<pstore::trailer::indices::write> (db_);
        r1index->insert_or_assign (t1, "key1"s, pstore::extent<char> ());
        t1.commit ();
    }
    db_.sync (0);
    auto r0index = pstore::index::get_index<pstore::trailer::indices::write> (db_);
    {
        transaction_type t2 = begin (db_, lock_guard{mutex_});

        // We're now synced to revision 1. Trying to insert into the index loaded from
        // r0 should raise an error.
        check_for_error (
            [&] () { r0index->insert_or_assign (t2, "key2"s, pstore::extent<char> ()); },
            pstore::error_code::index_not_latest_revision);
    }
}